

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O2

int coda_read_product_definition(coda_product_definition *product_definition)

{
  coda_product_class *current_product_class;
  int iVar1;
  za_file *zf;
  
  if (product_definition->initialized == 0) {
    current_product_class = product_definition->product_type->product_class;
    zf = coda_za_open(current_product_class->definition_file,handle_ziparchive_error);
    if (zf == (za_file *)0x0) {
      iVar1 = -1;
    }
    else {
      iVar1 = parse_entry(zf,ze_product,product_definition->name,current_product_class,
                          product_definition);
      coda_za_close(zf);
      iVar1 = -(uint)(iVar1 != 0);
    }
    return iVar1;
  }
  __assert_fail("!product_definition->initialized",
                "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                ,0x10b2,"int coda_read_product_definition(coda_product_definition *)");
}

Assistant:

int coda_read_product_definition(coda_product_definition *product_definition)
{
    coda_product_class *product_class;
    za_file *zf;

    assert(!product_definition->initialized);

    product_class = product_definition->product_type->product_class;

    zf = za_open(product_class->definition_file, handle_ziparchive_error);
    if (zf == NULL)
    {
        return -1;
    }
    if (parse_entry(zf, ze_product, product_definition->name, product_class, product_definition) != 0)
    {
        za_close(zf);
        return -1;
    }
    za_close(zf);

    return 0;
}